

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

btScalar btGjkEpaSolver2::SignedDistance
                   (btVector3 *position,btScalar margin,btConvexShape *shape0,btTransform *wtrs0,
                   sResults *results)

{
  bool bVar1;
  _ _Var2;
  code *pcVar3;
  U i;
  ulong uVar4;
  long *plVar5;
  btScalar bVar6;
  undefined8 uVar7;
  uint extraout_XMM0_Db;
  uint uVar8;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint uVar9;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  uint uVar10;
  float fVar11;
  btVector3 bVar12;
  btScalar margin_1;
  btScalar length;
  btScalar length_1;
  btVector3 delta_1;
  btVector3 delta;
  btSphereShape shape1;
  btTransform wtrs1;
  tShape shape;
  GJK gjk;
  float local_3c0;
  float local_3bc;
  undefined1 local_3b8 [16];
  float local_3a0;
  btScalar local_39c;
  btVector3 local_398;
  btVector3 local_388;
  btVector3 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  btSphereShape local_330;
  btVector3 local_2e8;
  btTransform local_2d8;
  tShape local_298;
  GJK local_208;
  
  btSphereShape::btSphereShape(&local_330,margin);
  local_208.m_shape.m_shapes[0] = (btConvexShape *)0x0;
  local_208.m_shape.m_shapes[1] = (btConvexShape *)0x3f80000000000000;
  btMatrix3x3::setRotation(&local_2d8.m_basis,(btQuaternion *)&local_208);
  local_2d8.m_origin.m_floats._0_8_ = *(undefined8 *)position->m_floats;
  local_2d8.m_origin.m_floats._8_8_ = *(undefined8 *)(position->m_floats + 2);
  gjkepa2_impl::Initialize
            (shape0,wtrs0,(btConvexShape *)&local_330,&local_2d8,results,&local_298,false);
  local_208.m_nfree = 0;
  local_208.m_current = 0;
  local_208.m_ray.m_floats[0] = 0.0;
  local_208.m_ray.m_floats[1] = 0.0;
  local_208.m_ray.m_floats[2] = 0.0;
  local_208.m_ray.m_floats[3] = 0.0;
  local_208.m_status = Failed;
  local_208.m_distance = 0.0;
  local_388.m_floats[2] = 1.0;
  local_388.m_floats[3] = 0.0;
  local_388.m_floats[0] = 1.0;
  local_388.m_floats[1] = 1.0;
  _Var2 = gjkepa2_impl::GJK::Evaluate(&local_208,&local_298,&local_388);
  local_3b8 = ZEXT816(0x7f7fffff);
  if (_Var2 == Inside) {
    bVar1 = Penetration(shape0,wtrs0,(btConvexShape *)&local_330,&local_2d8,&local_208.m_ray,results
                        ,true);
    if (!bVar1) goto LAB_00162c71;
    local_388 = operator-(results->witnesses,results->witnesses + 1);
    local_398.m_floats[0] = btVector3::length(&local_388);
    bVar6 = local_398.m_floats[0];
    uVar8 = extraout_XMM0_Db;
    uVar9 = extraout_XMM0_Dc_01;
    uVar10 = extraout_XMM0_Dd_01;
    if (1.1920929e-07 <= local_398.m_floats[0]) {
      bVar12 = operator/(&local_388,local_398.m_floats);
      *&(results->normal).m_floats = bVar12.m_floats;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      bVar6 = local_398.m_floats[0];
    }
    local_3b8._0_4_ = -bVar6;
    local_3b8._4_4_ = uVar8 ^ 0x80000000;
    local_3b8._8_4_ = uVar9 ^ 0x80000000;
    local_3b8._12_4_ = uVar10 ^ 0x80000000;
  }
  else {
    if (_Var2 != Valid) goto LAB_00162c71;
    fVar11 = 0.0;
    fStack_344 = 0.0;
    fStack_340 = 0.0;
    fStack_33c = 0.0;
    local_388.m_floats = (btScalar  [4])ZEXT816(0);
    local_398.m_floats[0] = 0.0;
    local_398.m_floats[1] = 0.0;
    local_398.m_floats[2] = 0.0;
    local_398.m_floats[3] = 0.0;
    local_3a0 = 0.0;
    uVar4 = 0;
    local_3c0 = 0.0;
    local_368 = 0;
    uStack_360 = 0;
    while( true ) {
      local_348 = fVar11;
      if ((local_208.m_simplex)->rank <= uVar4) break;
      plVar5 = (long *)((long)&(local_298.m_shapes[0]->super_btCollisionShape).
                               _vptr_btCollisionShape + local_298._136_8_);
      pcVar3 = (code *)local_298.Ls;
      if ((local_298.Ls & 1) != 0) {
        pcVar3 = *(code **)(local_298.Ls + *plVar5 + -1);
      }
      local_3b8 = ZEXT416((uint)(local_208.m_simplex)->p[uVar4]);
      uVar7 = (*pcVar3)(plVar5,(local_208.m_simplex)->c[uVar4]);
      bVar12.m_floats = local_388.m_floats;
      local_3c0 = local_3c0 + fVar11 * (float)local_3b8._0_4_;
      local_358 = (float)local_3b8._0_4_;
      fStack_354 = (float)local_3b8._0_4_;
      fStack_350 = (float)local_3b8._0_4_;
      fStack_34c = (float)local_3b8._0_4_;
      local_388.m_floats[0] = (float)local_368 + (float)uVar7 * (float)local_3b8._0_4_;
      local_388.m_floats[1] =
           local_368._4_4_ + (float)((ulong)uVar7 >> 0x20) * (float)local_3b8._0_4_;
      local_368 = CONCAT44(local_388.m_floats[1],local_388.m_floats[0]);
      uStack_360 = CONCAT44(uStack_360._4_4_ + extraout_XMM0_Dd * (float)local_3b8._0_4_,
                            (float)uStack_360 + extraout_XMM0_Dc * (float)local_3b8._0_4_);
      local_388.m_floats[3] = bVar12.m_floats[3];
      local_388.m_floats[2] = local_3c0;
      local_378 = operator-(&(local_208.m_simplex)->c[uVar4]->d);
      bVar12 = gjkepa2_impl::MinkowskiDiff::Support1(&local_298,&local_378);
      local_3a0 = local_3a0 + (float)local_3b8._0_4_ * bVar12.m_floats[2];
      fVar11 = local_348 + local_358 * bVar12.m_floats[0];
      fStack_344 = fStack_344 + fStack_354 * bVar12.m_floats[1];
      fStack_340 = fStack_340 + fStack_350 * extraout_XMM0_Dc_00;
      fStack_33c = fStack_33c + fStack_34c * extraout_XMM0_Dd_00;
      local_398.m_floats[1] = fStack_344;
      local_398.m_floats[0] = fVar11;
      local_398.m_floats[2] = local_3a0;
      uVar4 = uVar4 + 1;
    }
    bVar12 = btTransform::operator()(wtrs0,&local_388);
    *&results->witnesses[0].m_floats = bVar12.m_floats;
    bVar12 = btTransform::operator()(wtrs0,&local_398);
    *&results->witnesses[1].m_floats = bVar12.m_floats;
    local_378 = operator-(results->witnesses + 1,results->witnesses);
    bVar6 = btConvexShape::getMarginNonVirtual(shape0);
    local_3b8._0_4_ = bVar6;
    bVar6 = btConvexShape::getMarginNonVirtual((btConvexShape *)&local_330);
    local_3bc = (float)local_3b8._0_4_ + bVar6;
    local_39c = btVector3::length(&local_378);
    bVar12 = operator/(&local_378,&local_39c);
    *&(results->normal).m_floats = bVar12.m_floats;
    local_2e8 = operator*(&results->normal,&local_3bc);
    btVector3::operator+=(results->witnesses,&local_2e8);
    local_3b8._4_4_ = 0;
    local_3b8._8_4_ = 0;
    local_3b8._12_4_ = 0;
    local_3b8._0_4_ = local_39c - local_3bc;
  }
LAB_00162c71:
  btConvexShape::~btConvexShape((btConvexShape *)&local_330);
  return (btScalar)local_3b8._0_4_;
}

Assistant:

btScalar	btGjkEpaSolver2::SignedDistance(const btVector3& position,
											btScalar margin,
											const btConvexShape* shape0,
											const btTransform& wtrs0,
											sResults& results)
{
	tShape			shape;
	btSphereShape	shape1(margin);
	btTransform		wtrs1(btQuaternion(0,0,0,1),position);
	Initialize(shape0,wtrs0,&shape1,wtrs1,results,shape,false);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,btVector3(1,1,1));
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		const btVector3	delta=	results.witnesses[1]-
			results.witnesses[0];
		const btScalar	margin=	shape0->getMarginNonVirtual()+
			shape1.getMarginNonVirtual();
		const btScalar	length=	delta.length();	
		results.normal			=	delta/length;
		results.witnesses[0]	+=	results.normal*margin;
		return(length-margin);
	}
	else
	{
		if(gjk_status==GJK::eStatus::Inside)
		{
			if(Penetration(shape0,wtrs0,&shape1,wtrs1,gjk.m_ray,results))
			{
				const btVector3	delta=	results.witnesses[0]-
					results.witnesses[1];
				const btScalar	length=	delta.length();
				if (length >= SIMD_EPSILON)
					results.normal	=	delta/length;			
				return(-length);
			}
		}	
	}
	return(SIMD_INFINITY);
}